

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O2

Value __thiscall
MiniScript::Parser::ParseAddSub(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  int iVar1;
  ParseState *this_00;
  bool bVar2;
  undefined7 in_register_00000011;
  Lexer *this_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  char in_R8B;
  Value VVar3;
  Value opB;
  Token tok;
  Lexer local_158;
  Value local_150;
  Value local_140;
  Lexer local_130;
  undefined1 local_128 [16];
  Lexer local_118;
  undefined1 local_110 [56];
  String local_d8;
  bool local_c8;
  Value local_c0;
  Token local_b0;
  TACLine local_90;
  
  this_01 = (Lexer *)CONCAT71(in_register_00000011,asLval);
  local_158.ls = this_01->ls;
  if (local_158.ls != (LexerStorage *)0x0) {
    (local_158.ls)->refCount = (local_158.ls)->refCount + 1;
  }
  ParseMultDiv(this,tokens,SUB81(&local_158,0),statementStart);
  Lexer::release(&local_158);
  Lexer::Peek((Token *)(local_110 + 0x30),this_01);
  do {
    if (local_110._48_4_ != 6) {
      if (local_110._48_4_ != 7) {
LAB_00133646:
        String::~String(&local_d8);
        VVar3.data.number = extraout_RDX.number;
        VVar3._0_8_ = this;
        return VVar3;
      }
      if ((in_R8B != '\0') && (local_c8 == true)) {
        bVar2 = Lexer::isAtWhitespace(this_01);
        if (!bVar2) goto LAB_00133646;
      }
    }
    Lexer::Dequeue(&local_b0,this_01);
    String::~String(&local_b0.text);
    local_118.ls = this_01->ls;
    if (local_118.ls != (LexerStorage *)0x0) {
      (local_118.ls)->refCount = (local_118.ls)->refCount + 1;
    }
    AllowLineBreak(&local_118);
    Lexer::release(&local_118);
    Value::Value(&local_c0,(Value *)this);
    FullyEvaluate((Parser *)local_110,(Value *)tokens,(LocalOnlyMode)&local_c0);
    Value::operator=((Value *)this,(Value *)local_110);
    Value::~Value((Value *)local_110);
    Value::~Value(&local_c0);
    local_130.ls = this_01->ls;
    if (local_130.ls != (LexerStorage *)0x0) {
      (local_130.ls)->refCount = (local_130.ls)->refCount + 1;
    }
    ParseMultDiv((Parser *)local_128,tokens,SUB81(&local_130,0),false);
    Lexer::release(&local_130);
    this_00 = (ParseState *)tokens[6].ls;
    iVar1 = this_00->nextTempNum;
    this_00->nextTempNum = iVar1 + 1;
    local_140.type = Temp;
    local_140.noInvoke = false;
    local_140.localOnly = Off;
    bVar2 = local_110._48_4_ != 6;
    local_140.data.tempNum = iVar1;
    Value::Value((Value *)(local_110 + 0x20),(Value *)this);
    local_150.type = local_128[0];
    local_150.noInvoke = (bool)local_128[1];
    local_150.localOnly = local_128[2];
    local_150.data.ref = (RefCountedStorage *)local_128._8_8_;
    if ((RefCountedStorage *)local_128._8_8_ != (RefCountedStorage *)0x0 && Temp < local_128[0]) {
      *(long *)(local_128._8_8_ + 8) = *(long *)(local_128._8_8_ + 8) + 1;
    }
    TACLine::TACLine(&local_90,&local_140,bVar2 + APlusB,(Value *)(local_110 + 0x20),&local_150);
    ParseState::Add(this_00,&local_90);
    TACLine::~TACLine(&local_90);
    Value::~Value(&local_150);
    Value::~Value((Value *)(local_110 + 0x20));
    Value::~Value(&local_140);
    local_110._0_2_ = Number;
    local_110[2] = Unknown >> 0x10;
    local_110._8_4_ = iVar1;
    Value::operator=((Value *)this,(Value *)local_110);
    Value::~Value((Value *)local_110);
    Lexer::Peek((Token *)local_110,this_01);
    Token::operator=((Token *)(local_110 + 0x30),(Token *)local_110);
    String::~String((String *)(local_110 + 8));
    Value::~Value((Value *)local_128);
  } while( true );
}

Assistant:

Value Parser::ParseAddSub(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseMultDiv;
		Value val = (*this.*nextLevel)(tokens, asLval, statementStart);
		Token tok = tokens.Peek();
		while (tok.type == Token::Type::OpPlus ||
			   (tok.type == Token::Type::OpMinus
				&& (!statementStart || !tok.afterSpace  || tokens.isAtWhitespace()))) {
			tokens.Dequeue();

			AllowLineBreak(tokens); // allow a line break after a binary operator
				   
			val = FullyEvaluate(val);
			Value opB = (*this.*nextLevel)(tokens, false, false);
			int tempNum = output->nextTempNum++;
			output->Add(TACLine(Value::Temp(tempNum),
							   tok.type == Token::Type::OpPlus ? TACLine::Op::APlusB : TACLine::Op::AMinusB,
							   val, opB));
			val = Value::Temp(tempNum);
			
			tok = tokens.Peek();
		}
		return val;
	}